

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O1

void __thiscall
nuraft::raft_server::handle_custom_notification_resp(raft_server *this,resp_msg *resp)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  int iVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  string local_30;
  
  if (resp->accepted_ == true) {
    iVar4 = (resp->super_msg_base).src_;
    uVar1 = (this->peers_)._M_h._M_bucket_count;
    uVar6 = (ulong)(long)iVar4 % uVar1;
    p_Var7 = (this->peers_)._M_h._M_buckets[uVar6];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var7->_M_nxt, p_Var8 = p_Var7, iVar4 != *(int *)&p_Var7->_M_nxt[1]._M_nxt)) {
      while (p_Var7 = p_Var5, p_Var5 = p_Var7->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var5[1]._M_nxt % uVar1 != uVar6) ||
           (p_Var8 = p_Var7, iVar4 == *(int *)&p_Var5[1]._M_nxt)) goto LAB_0011681c;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_0011681c:
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var8->_M_nxt;
    }
    if (p_Var5 == (_Hash_node_base *)0x0) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) &&
         (iVar4 = (**(code **)(*(long *)peVar3 + 0x38))(), 3 < iVar4)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_30,"the response is from an unknown peer %d",
                   (ulong)(uint)(resp->super_msg_base).src_);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                   ,"handle_custom_notification_resp",0xfe,&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p);
        }
      }
    }
    else {
      p_Var2 = p_Var5[2]._M_nxt;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5[3]._M_nxt;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        LOCK();
        p_Var2[0xd]._M_nxt = (_Hash_node_base *)resp->next_idx_;
        UNLOCK();
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        LOCK();
        p_Var2[0xd]._M_nxt = (_Hash_node_base *)resp->next_idx_;
        UNLOCK();
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_custom_notification_resp(resp_msg& resp) {
    if (!resp.get_accepted()) return;

    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }
    ptr<peer> p = it->second;

    p->set_next_log_idx(resp.get_next_idx());
}